

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

int secp256k1_scalar_add(secp256k1_scalar *r,secp256k1_scalar *a,secp256k1_scalar *b)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint overflow;
  ulong uVar6;
  ulong uVar7;
  
  secp256k1_scalar_verify(a);
  secp256k1_scalar_verify(b);
  uVar1 = b->d[0];
  uVar3 = a->d[0];
  r->d[0] = uVar1 + a->d[0];
  uVar1 = (ulong)CARRY8(uVar1,uVar3);
  uVar3 = a->d[1] + uVar1;
  uVar4 = (ulong)CARRY8(a->d[1],uVar1);
  uVar1 = b->d[1];
  r->d[1] = uVar3 + b->d[1];
  uVar1 = (ulong)CARRY8(uVar3,uVar1);
  uVar3 = uVar4 + a->d[2];
  uVar5 = uVar3 + uVar1;
  uVar6 = (ulong)(CARRY8(uVar4,a->d[2]) || CARRY8(uVar3,uVar1));
  uVar1 = b->d[2];
  r->d[2] = uVar5 + b->d[2];
  uVar4 = (ulong)CARRY8(uVar5,uVar1);
  uVar1 = a->d[3];
  uVar5 = uVar6 + a->d[3];
  uVar7 = uVar5 + uVar4;
  uVar3 = b->d[3];
  r->d[3] = uVar7 + uVar3;
  iVar2 = secp256k1_scalar_check_overflow(r);
  overflow = (uint)(CARRY8(uVar6,uVar1) || CARRY8(uVar5,uVar4)) + iVar2 + (uint)CARRY8(uVar7,uVar3);
  if (overflow < 2) {
    secp256k1_scalar_reduce(r,overflow);
    secp256k1_scalar_verify(r);
    return overflow;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/scalar_4x64_impl.h"
          ,0x78,"test condition failed: overflow == 0 || overflow == 1");
  abort();
}

Assistant:

static int secp256k1_scalar_add(secp256k1_scalar *r, const secp256k1_scalar *a, const secp256k1_scalar *b) {
    int overflow;
    secp256k1_uint128 t;
    SECP256K1_SCALAR_VERIFY(a);
    SECP256K1_SCALAR_VERIFY(b);

    secp256k1_u128_from_u64(&t, a->d[0]);
    secp256k1_u128_accum_u64(&t, b->d[0]);
    r->d[0] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, a->d[1]);
    secp256k1_u128_accum_u64(&t, b->d[1]);
    r->d[1] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, a->d[2]);
    secp256k1_u128_accum_u64(&t, b->d[2]);
    r->d[2] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, a->d[3]);
    secp256k1_u128_accum_u64(&t, b->d[3]);
    r->d[3] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    overflow = secp256k1_u128_to_u64(&t) + secp256k1_scalar_check_overflow(r);
    VERIFY_CHECK(overflow == 0 || overflow == 1);
    secp256k1_scalar_reduce(r, overflow);

    SECP256K1_SCALAR_VERIFY(r);
    return overflow;
}